

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

Ref<glTF2::Node> FindSkeletonRootJoint(Ref<glTF2::Skin> *skinRef)

{
  byte bVar1;
  Skin *pSVar2;
  reference pvVar3;
  Node *pNVar4;
  Ref<glTF2::Node> RVar5;
  undefined1 local_30 [8];
  Ref<glTF2::Node> startNodeRef;
  Ref<glTF2::Skin> *skinRef_local;
  Ref<glTF2::Node> parentNodeRef;
  
  startNodeRef._8_8_ = skinRef;
  glTF2::Ref<glTF2::Node>::Ref((Ref<glTF2::Node> *)local_30);
  glTF2::Ref<glTF2::Node>::Ref((Ref<glTF2::Node> *)&skinRef_local);
  pSVar2 = glTF2::Ref<glTF2::Skin>::operator->((Ref<glTF2::Skin> *)startNodeRef._8_8_);
  pvVar3 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::
           operator[](&pSVar2->jointNames,0);
  local_30 = (undefined1  [8])pvVar3->vector;
  startNodeRef.vector._0_4_ = pvVar3->index;
  pSVar2 = glTF2::Ref<glTF2::Skin>::operator->((Ref<glTF2::Skin> *)startNodeRef._8_8_);
  pvVar3 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::
           operator[](&pSVar2->jointNames,0);
  skinRef_local = (Ref<glTF2::Skin> *)pvVar3->vector;
  parentNodeRef.vector._0_4_ = pvVar3->index;
  do {
    local_30 = (undefined1  [8])skinRef_local;
    startNodeRef.vector._0_4_ = (uint)parentNodeRef.vector;
    pNVar4 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)local_30);
    skinRef_local = (Ref<glTF2::Skin> *)(pNVar4->parent).vector;
    parentNodeRef.vector._0_4_ = (pNVar4->parent).index;
    glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)&skinRef_local);
    bVar1 = std::__cxx11::string::empty();
  } while (((bVar1 ^ 0xff) & 1) != 0);
  RVar5.index = (uint)parentNodeRef.vector;
  RVar5.vector = (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)skinRef_local;
  RVar5._12_4_ = 0;
  return RVar5;
}

Assistant:

Ref<Node> FindSkeletonRootJoint(Ref<Skin>& skinRef)
{
    Ref<Node> startNodeRef;
    Ref<Node> parentNodeRef;

    // Arbitrarily use the first joint to start the search.
    startNodeRef = skinRef->jointNames[0];
    parentNodeRef = skinRef->jointNames[0];

    do {
        startNodeRef = parentNodeRef;
        parentNodeRef = startNodeRef->parent;
    } while (!parentNodeRef->jointName.empty());

    return parentNodeRef;
}